

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontStructMatrix.cpp
# Opt level: O1

int __thiscall
TPZFrontStructMatrix<TPZFrontNonSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
::ClassId(TPZFrontStructMatrix<TPZFrontNonSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
          *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  string local_170;
  TPZFrontNonSym<std::complex<double>_> local_150;
  
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"TPZFrontStructMatrix","");
  uVar1 = Hash(&local_170);
  iVar2 = TPZStructMatrixT<std::complex<double>_>::ClassId
                    (&this->super_TPZStructMatrixT<std::complex<double>_>);
  TPZFrontNonSym<std::complex<double>_>::TPZFrontNonSym(&local_150);
  iVar3 = TPZFrontNonSym<std::complex<double>_>::ClassId(&local_150);
  iVar4 = TPZStructMatrixTBBFlow<std::complex<double>_>::ClassId
                    ((TPZStructMatrixTBBFlow<std::complex<double>_> *)
                     &(this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.
                      field_0xa0);
  TPZFrontNonSym<std::complex<double>_>::~TPZFrontNonSym(&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  return iVar4 << 3 ^ iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZFrontStructMatrix<TFront,TVar,TPar>::ClassId() const{
    return Hash("TPZFrontStructMatrix") ^
        (TPZStructMatrixT<TVar>::ClassId()<< 1 ) ^
        TFront().ClassId() << 2 ^
        TPar::ClassId() << 3;
}